

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dielectric.hpp
# Opt level: O2

Color __thiscall
DielectricBRDF::sample_f
          (DielectricBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  float extraout_XMM0_Da;
  undefined1 extraout_var [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  Color CVar9;
  float cost;
  float local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 local_38 [16];
  undefined1 auVar7 [16];
  
  fVar1 = *(float *)&(this->super_DiracBxDF).field_0x8;
  uVar4 = -(uint)(0.0 < wo->z);
  fVar1 = (float)(uVar4 & (uint)fVar1 | ~uVar4 & (uint)(1.0 / fVar1));
  local_38 = ZEXT416((uint)fVar1);
  local_48 = reflectivity(ABS(wo->z),&local_4c,fVar1);
  uStack_44 = extraout_var._0_4_;
  uStack_40 = extraout_var._4_4_;
  uStack_3c = extraout_var._8_4_;
  if ((local_48 != 1.0) || (NAN(local_48))) {
    (**sampler->_vptr_Sampler)(sampler);
    if (local_48 <= extraout_XMM0_Da) {
      fVar1 = wo->z;
      uVar3._0_4_ = wo->x;
      uVar3._4_4_ = wo->y;
      auVar5._0_8_ = uVar3 ^ 0x8000000080000000;
      auVar5._8_4_ = 0x80000000;
      auVar5._12_4_ = 0x80000000;
      fVar8 = local_38._0_4_;
      auVar7._0_8_ = local_38._0_8_;
      auVar7._8_4_ = local_38._4_4_;
      auVar7._12_4_ = local_38._4_4_;
      auVar6._8_8_ = auVar7._8_8_;
      auVar6._4_4_ = fVar8;
      auVar6._0_4_ = fVar8;
      auVar5 = divps(auVar5,auVar6);
      wi->x = (float)(int)auVar5._0_8_;
      wi->y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
      wi->z = (-fVar1 * local_4c) / ABS(fVar1);
      *pdf = 1.0 - local_48;
      local_48 = (1.0 - local_48) / (ABS(wi->z) * fVar8 * fVar8);
      goto LAB_00135004;
    }
  }
  uVar2._0_4_ = wo->x;
  uVar2._4_4_ = wo->y;
  fVar1 = wo->z;
  wi->x = (float)(int)(uVar2 ^ 0x8000000080000000);
  wi->y = (float)(int)((uVar2 ^ 0x8000000080000000) >> 0x20);
  wi->z = fVar1;
  *pdf = local_48;
  local_48 = local_48 / ABS(wi->z);
LAB_00135004:
  CVar9.y = local_48;
  CVar9.x = local_48;
  CVar9.z = local_48;
  return CVar9;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		float ior = wo.z>0? IOR: 1/IOR;
		float cost;
		float r = reflectivity(fabs(wo.z), cost, ior);

		if (r == 1 || sampler.get1f()<r) // reflected
		{
			wi = vec3f(-wo.x, -wo.y, wo.z);
			pdf = r;
			return r / fabs(wi.z);
		}
		else // transmitted
		{
			wi = vec3f(-wo.x/ior, -wo.y/ior, -wo.z * cost/fabs(wo.z));
			pdf = 1-r;
			return (1-r) / (fabs(wi.z) * ior * ior);
			// the 1/ior^2 coefficient is used to convert energy to radiance
			// see note_refract_radiance
		}
	}